

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocService.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b98cf::AllocService::untrack_mem_cb
          (AllocService *this,Caliper *c,ChannelBody *chB,void *ptr)

{
  Node *label_node;
  bool bVar1;
  AllocInfo *pAVar2;
  lock_guard<std::mutex> local_d8;
  lock_guard<std::mutex> g_1;
  Variant local_c0;
  uint local_b0;
  HasStartAddress local_a0;
  SplayTree<(anonymous_namespace)::AllocInfo,_(anonymous_namespace)::AllocInfoCmp> local_98;
  SplayTree<(anonymous_namespace)::AllocInfo,_(anonymous_namespace)::AllocInfoCmp> tree_node;
  lock_guard<std::mutex> g;
  AllocInfo info;
  void *ptr_local;
  ChannelBody *chB_local;
  Caliper *c_local;
  AllocService *this_local;
  
  info.addr_label_nodes[3] = (Node *)ptr;
  AllocInfo::AllocInfo((AllocInfo *)&g);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&tree_node,&this->g_tree_lock);
  HasStartAddress::HasStartAddress(&local_a0,(uint64_t)info.addr_label_nodes[3]);
  cali::SplayTree<(anonymous_namespace)::AllocInfo,_(anonymous_namespace)::AllocInfoCmp>::
  find<(anonymous_namespace)::HasStartAddress>(&local_98,(HasStartAddress *)&this->g_tree);
  bVar1 = cali::SplayTree::operator_cast_to_bool((SplayTree *)&local_98);
  if (bVar1) {
    pAVar2 = cali::SplayTree<(anonymous_namespace)::AllocInfo,_(anonymous_namespace)::AllocInfoCmp>
             ::operator*(&local_98);
    info.addr_label_nodes[1] = pAVar2->addr_label_nodes[2];
    info.addr_label_nodes[2] = pAVar2->addr_label_nodes[3];
    info.free_label_node = pAVar2->addr_label_nodes[0];
    info.addr_label_nodes[0] = pAVar2->addr_label_nodes[1];
    g._M_device = (mutex_type *)pAVar2->start_addr;
    info.start_addr = pAVar2->total_size;
    info.total_size = (pAVar2->v_uid).m_v.type_and_size;
    info.v_uid.m_v.type_and_size = (pAVar2->v_uid).m_v.value.v_uint;
    info.v_uid.m_v.value = (anon_union_8_7_33918203_for_value)pAVar2->elem_size;
    info.elem_size = pAVar2->num_elems;
    info.num_elems = (size_t)pAVar2->alloc_label_node;
    info.alloc_label_node = pAVar2->free_label_node;
    cali::SplayTree<(anonymous_namespace)::AllocInfo,_(anonymous_namespace)::AllocInfoCmp>::remove
              (&this->g_tree,(char *)&local_98);
    this->g_current_tracked = this->g_current_tracked - 1;
  }
  else {
    this->g_failed_untrack = this->g_failed_untrack + 1;
  }
  local_b0 = (uint)!bVar1;
  cali::SplayTree<(anonymous_namespace)::AllocInfo,_(anonymous_namespace)::AllocInfoCmp>::~SplayTree
            (&local_98);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&tree_node);
  label_node = info.alloc_label_node;
  if (local_b0 == 0) {
    if ((this->g_track_allocations & 1U) != 0) {
      cali::Variant::Variant(&local_c0,-(int)info.start_addr);
      cali::Variant::Variant((Variant *)&g_1,CALI_TYPE_ADDR,info.addr_label_nodes + 3,8);
      track_mem_snapshot(this,c,chB,label_node,&local_c0,(Variant *)&info.total_size,(Variant *)&g_1
                        );
    }
    std::lock_guard<std::mutex>::lock_guard(&local_d8,&this->g_hwm_lock);
    this->g_active_mem = this->g_active_mem - info.start_addr;
    std::lock_guard<std::mutex>::~lock_guard(&local_d8);
  }
  return;
}

Assistant:

void untrack_mem_cb(Caliper* c, ChannelBody* chB, const void* ptr)
    {
        AllocInfo info;

        {
            std::lock_guard<std::mutex> g(g_tree_lock);

            auto tree_node = g_tree.find(HasStartAddress(reinterpret_cast<uint64_t>(ptr)));

            if (!tree_node) {
                ++g_failed_untrack;
                return;
            }

            info = *tree_node;
            g_tree.remove(tree_node);

            --g_current_tracked;
        }

        if (g_track_allocations)
            track_mem_snapshot(
                c,
                chB,
                info.free_label_node,
                Variant(-static_cast<int>(info.total_size)),
                info.v_uid,
                Variant(CALI_TYPE_ADDR, &ptr, sizeof(void*))
            );

        {
            std::lock_guard<std::mutex> g(g_hwm_lock);

            g_active_mem -= info.total_size;
        }
    }